

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmi2mid.cc
# Opt level: O2

size_t xmi_process_multi(PBuffer *buffer,MidiFile *midi)

{
  size_t sVar1;
  Stream *this;
  allocator<char> local_81;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  PBuffer type;
  string local_58 [32];
  string name;
  
  Buffer::pop((Buffer *)&type,
              (size_t)(buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  Buffer::operator_cast_to_string
            (&name,type.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"xmi2mid",&local_81);
  Log::Logger::operator[]((Logger *)local_80,(string *)&Log::Verbose);
  this = Log::Stream::operator<<((Stream *)local_80,"\tchunk subtype: ");
  Log::Stream::operator<<(this,&name);
  Log::Stream::~Stream((Stream *)local_80);
  std::__cxx11::string::~string(local_58);
  Buffer::get_tail((Buffer *)local_78,
                   (size_t)(buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  xmi_process_chunks((PBuffer *)local_78,midi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  sVar1 = ((buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size;
  std::__cxx11::string::~string((string *)&name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&type.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return sVar1;
}

Assistant:

static size_t
xmi_process_multi(PBuffer buffer, MidiFile *midi) {
  PBuffer type = buffer->pop(4);
  std::string name = *type.get();
  Log::Verbose["xmi2mid"] << "\tchunk subtype: " << name;
  xmi_process_chunks(buffer->get_tail(4), midi);
  return buffer->get_size();
}